

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O1

void __thiscall
icu_63::TailoredSet::compare(TailoredSet *this,UChar32 c,uint32_t ce32,uint32_t baseCE32)

{
  UChar *pUVar1;
  UBool UVar2;
  uint32_t uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined2 *puVar8;
  CollationData *d;
  UChar *pUVar9;
  int iVar10;
  
  if ((ce32 & 0xcf) == 200) {
    pUVar9 = this->data->contexts + (ce32 >> 0xd);
    ce32 = CollationData::getFinalCE32(this->data,CONCAT22(*pUVar9,pUVar9[1]));
    if ((baseCE32 & 0xcf) == 200) {
      pUVar1 = this->baseData->contexts + (baseCE32 >> 0xd);
      baseCE32 = CollationData::getFinalCE32(this->baseData,CONCAT22(*pUVar1,pUVar1[1]));
      comparePrefixes(this,c,pUVar9 + 2,pUVar1 + 2);
    }
    else {
      d = this->data;
LAB_0024056b:
      addPrefixes(this,d,c,pUVar9 + 2);
    }
  }
  else if ((baseCE32 & 0xcf) == 200) {
    pUVar9 = this->baseData->contexts + (baseCE32 >> 0xd);
    baseCE32 = CollationData::getFinalCE32(this->baseData,CONCAT22(*pUVar9,pUVar9[1]));
    d = this->baseData;
    goto LAB_0024056b;
  }
  if ((ce32 & 0xcf) == 0xc9) {
    pUVar9 = (UChar *)((ulong)(ce32 >> 0xc & 0xfffffffe) + (long)this->data->contexts);
    uVar5 = ce32 >> 8;
    ce32 = 1;
    if ((uVar5 & 1) == 0) {
      ce32 = CollationData::getFinalCE32(this->data,CONCAT22(*pUVar9,pUVar9[1]));
    }
    if ((baseCE32 & 0xcf) == 0xc9) {
      puVar8 = (undefined2 *)
               ((ulong)(baseCE32 >> 0xc & 0xfffffffe) + (long)this->baseData->contexts);
      uVar5 = baseCE32 >> 8;
      baseCE32 = 1;
      if ((uVar5 & 1) == 0) {
        baseCE32 = CollationData::getFinalCE32(this->baseData,CONCAT22(*puVar8,puVar8[1]));
      }
      compareContractions(this,c,pUVar9 + 2,puVar8 + 2);
      goto LAB_00240673;
    }
  }
  else {
    if ((baseCE32 & 0xcf) != 0xc9) goto LAB_00240673;
    pUVar9 = this->baseData->contexts + (baseCE32 >> 0xd);
    baseCE32 = CollationData::getFinalCE32(this->baseData,CONCAT22(*pUVar9,pUVar9[1]));
  }
  addContractions(this,c,pUVar9 + 2);
LAB_00240673:
  uVar5 = -(uint)((~ce32 & 0xc0) != 0) | ce32 & 0xf;
  uVar6 = -(uint)((~baseCE32 & 0xc0) != 0) | baseCE32 & 0xf;
  if (((uVar6 != 0xe) ||
      (((ce32 & 0xcf) == 0xc1 &&
       (uVar3 = Collation::getThreeBytePrimaryForOffsetData(c,this->baseData->ces[baseCE32 >> 0xd]),
       (ce32 & 0xffffff00) == uVar3)))) && (uVar5 == uVar6)) {
    if (uVar5 == 0xc) {
      iVar7 = c + -0xac00;
      UVar2 = UnicodeSet::contains
                        (this->tailored,
                         ((uint)((ulong)((long)iVar7 * 0x6f74ae27) >> 0x28) - (iVar7 >> 0x1f)) +
                         0x1100 & 0xffff);
      if (UVar2 == '\0') {
        iVar10 = (int)((ulong)((long)iVar7 * -0x6db6db6d) >> 0x20) + c + -0xac00;
        iVar10 = (iVar10 >> 4) - (iVar10 >> 0x1f);
        UVar2 = UnicodeSet::contains(this->tailored,iVar10 % 0x15 + 0x1161U & 0xffff);
        if (UVar2 == '\0') {
          iVar7 = iVar7 + iVar10 * -0x1c;
          if (iVar7 == 0) {
            return;
          }
          UVar2 = UnicodeSet::contains(this->tailored,iVar7 + 0x11a7U & 0xffff);
          if (UVar2 == '\0') {
            return;
          }
        }
      }
    }
    else if (uVar5 == 6) {
      uVar5 = ce32 >> 8 & 0x1f;
      if (uVar5 == (baseCE32 >> 8 & 0x1f)) {
        if (uVar5 == 0) {
          return;
        }
        uVar4 = 0;
        while (*(long *)((long)this->data->ces + uVar4 * 8 + (ulong)(ce32 >> 10 & 0xfffffff8)) ==
               *(long *)((long)this->baseData->ces +
                        uVar4 * 8 + (ulong)(baseCE32 >> 10 & 0xfffffff8))) {
          uVar4 = uVar4 + 1;
          if (uVar5 == uVar4) {
            return;
          }
        }
      }
    }
    else if (uVar5 == 5) {
      uVar5 = ce32 >> 8 & 0x1f;
      if (uVar5 == (baseCE32 >> 8 & 0x1f)) {
        if (uVar5 != 0) {
          uVar4 = 0;
          do {
            if (*(int *)((long)this->data->ce32s + uVar4 * 4 + (ulong)(ce32 >> 0xb & 0xfffffffc)) !=
                *(int *)((long)this->baseData->ce32s +
                        uVar4 * 4 + (ulong)(baseCE32 >> 0xb & 0xfffffffc))) goto LAB_0024088b;
            uVar4 = uVar4 + 1;
          } while (uVar5 != uVar4);
        }
        return;
      }
    }
    else if (ce32 == baseCE32) {
      return;
    }
  }
LAB_0024088b:
  add(this,c);
  return;
}

Assistant:

void
TailoredSet::compare(UChar32 c, uint32_t ce32, uint32_t baseCE32) {
    if(Collation::isPrefixCE32(ce32)) {
        const UChar *p = data->contexts + Collation::indexFromCE32(ce32);
        ce32 = data->getFinalCE32(CollationData::readCE32(p));
        if(Collation::isPrefixCE32(baseCE32)) {
            const UChar *q = baseData->contexts + Collation::indexFromCE32(baseCE32);
            baseCE32 = baseData->getFinalCE32(CollationData::readCE32(q));
            comparePrefixes(c, p + 2, q + 2);
        } else {
            addPrefixes(data, c, p + 2);
        }
    } else if(Collation::isPrefixCE32(baseCE32)) {
        const UChar *q = baseData->contexts + Collation::indexFromCE32(baseCE32);
        baseCE32 = baseData->getFinalCE32(CollationData::readCE32(q));
        addPrefixes(baseData, c, q + 2);
    }

    if(Collation::isContractionCE32(ce32)) {
        const UChar *p = data->contexts + Collation::indexFromCE32(ce32);
        if((ce32 & Collation::CONTRACT_SINGLE_CP_NO_MATCH) != 0) {
            ce32 = Collation::NO_CE32;
        } else {
            ce32 = data->getFinalCE32(CollationData::readCE32(p));
        }
        if(Collation::isContractionCE32(baseCE32)) {
            const UChar *q = baseData->contexts + Collation::indexFromCE32(baseCE32);
            if((baseCE32 & Collation::CONTRACT_SINGLE_CP_NO_MATCH) != 0) {
                baseCE32 = Collation::NO_CE32;
            } else {
                baseCE32 = baseData->getFinalCE32(CollationData::readCE32(q));
            }
            compareContractions(c, p + 2, q + 2);
        } else {
            addContractions(c, p + 2);
        }
    } else if(Collation::isContractionCE32(baseCE32)) {
        const UChar *q = baseData->contexts + Collation::indexFromCE32(baseCE32);
        baseCE32 = baseData->getFinalCE32(CollationData::readCE32(q));
        addContractions(c, q + 2);
    }

    int32_t tag;
    if(Collation::isSpecialCE32(ce32)) {
        tag = Collation::tagFromCE32(ce32);
        U_ASSERT(tag != Collation::PREFIX_TAG);
        U_ASSERT(tag != Collation::CONTRACTION_TAG);
        // Currently, the tailoring data builder does not write offset tags.
        // They might be useful for saving space,
        // but they would complicate the builder,
        // and in tailorings we assume that performance of tailored characters is more important.
        U_ASSERT(tag != Collation::OFFSET_TAG);
    } else {
        tag = -1;
    }
    int32_t baseTag;
    if(Collation::isSpecialCE32(baseCE32)) {
        baseTag = Collation::tagFromCE32(baseCE32);
        U_ASSERT(baseTag != Collation::PREFIX_TAG);
        U_ASSERT(baseTag != Collation::CONTRACTION_TAG);
    } else {
        baseTag = -1;
    }

    // Non-contextual mappings, expansions, etc.
    if(baseTag == Collation::OFFSET_TAG) {
        // We might be comparing a tailoring CE which is a copy of
        // a base offset-tag CE, via the [optimize [set]] syntax
        // or when a single-character mapping was copied for tailored contractions.
        // Offset tags always result in long-primary CEs,
        // with common secondary/tertiary weights.
        if(!Collation::isLongPrimaryCE32(ce32)) {
            add(c);
            return;
        }
        int64_t dataCE = baseData->ces[Collation::indexFromCE32(baseCE32)];
        uint32_t p = Collation::getThreeBytePrimaryForOffsetData(c, dataCE);
        if(Collation::primaryFromLongPrimaryCE32(ce32) != p) {
            add(c);
            return;
        }
    }

    if(tag != baseTag) {
        add(c);
        return;
    }

    if(tag == Collation::EXPANSION32_TAG) {
        const uint32_t *ce32s = data->ce32s + Collation::indexFromCE32(ce32);
        int32_t length = Collation::lengthFromCE32(ce32);

        const uint32_t *baseCE32s = baseData->ce32s + Collation::indexFromCE32(baseCE32);
        int32_t baseLength = Collation::lengthFromCE32(baseCE32);

        if(length != baseLength) {
            add(c);
            return;
        }
        for(int32_t i = 0; i < length; ++i) {
            if(ce32s[i] != baseCE32s[i]) {
                add(c);
                break;
            }
        }
    } else if(tag == Collation::EXPANSION_TAG) {
        const int64_t *ces = data->ces + Collation::indexFromCE32(ce32);
        int32_t length = Collation::lengthFromCE32(ce32);

        const int64_t *baseCEs = baseData->ces + Collation::indexFromCE32(baseCE32);
        int32_t baseLength = Collation::lengthFromCE32(baseCE32);

        if(length != baseLength) {
            add(c);
            return;
        }
        for(int32_t i = 0; i < length; ++i) {
            if(ces[i] != baseCEs[i]) {
                add(c);
                break;
            }
        }
    } else if(tag == Collation::HANGUL_TAG) {
        UChar jamos[3];
        int32_t length = Hangul::decompose(c, jamos);
        if(tailored->contains(jamos[0]) || tailored->contains(jamos[1]) ||
                (length == 3 && tailored->contains(jamos[2]))) {
            add(c);
        }
    } else if(ce32 != baseCE32) {
        add(c);
    }
}